

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeMemMove(Mem *pTo,Mem *pFrom)

{
  MemValue MVar1;
  char *pcVar2;
  char *pcVar3;
  sqlite3 *psVar4;
  u32 uVar5;
  u16 uVar6;
  u8 uVar7;
  u8 uVar8;
  int iVar9;
  
  sqlite3VdbeMemRelease(pTo);
  pTo->xDel = pFrom->xDel;
  MVar1 = pFrom->u;
  uVar6 = pFrom->flags;
  uVar7 = pFrom->enc;
  uVar8 = pFrom->eSubtype;
  iVar9 = pFrom->n;
  pcVar2 = pFrom->z;
  pcVar3 = pFrom->zMalloc;
  uVar5 = pFrom->uTemp;
  psVar4 = pFrom->db;
  pTo->szMalloc = pFrom->szMalloc;
  pTo->uTemp = uVar5;
  pTo->db = psVar4;
  pTo->z = pcVar2;
  pTo->zMalloc = pcVar3;
  pTo->u = MVar1;
  pTo->flags = uVar6;
  pTo->enc = uVar7;
  pTo->eSubtype = uVar8;
  pTo->n = iVar9;
  pFrom->flags = 1;
  pFrom->szMalloc = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemMove(Mem *pTo, Mem *pFrom){
  assert( pFrom->db==0 || sqlite3_mutex_held(pFrom->db->mutex) );
  assert( pTo->db==0 || sqlite3_mutex_held(pTo->db->mutex) );
  assert( pFrom->db==0 || pTo->db==0 || pFrom->db==pTo->db );

  sqlite3VdbeMemRelease(pTo);
  memcpy(pTo, pFrom, sizeof(Mem));
  pFrom->flags = MEM_Null;
  pFrom->szMalloc = 0;
}